

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeMinMaxValues
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *side,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *val,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *minRes,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *maxRes,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *minVal,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *maxVal)

{
  Tolerances *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  Real RVar4;
  bool bVar5;
  int iVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  double local_1d8;
  cpp_dec_float<50U,_int,_void> local_1c8;
  cpp_dec_float<50U,_int,_void> *local_188;
  cpp_dec_float<50U,_int,_void> *local_180;
  cpp_dec_float<50U,_int,_void> local_178;
  undefined4 local_138;
  uint uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_188 = &maxRes->m_backend;
  local_180 = &minRes->m_backend;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&minVal->m_backend,0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&maxVal->m_backend,0);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_e8.m_backend.exp = (val->m_backend).exp;
  local_e8.m_backend.neg = (val->m_backend).neg;
  local_e8.m_backend.fpclass = (val->m_backend).fpclass;
  local_e8.m_backend.prec_elem = (val->m_backend).prec_elem;
  local_68.m_backend.fpclass = cpp_dec_float_finite;
  local_68.m_backend.prec_elem = 10;
  local_68.m_backend.data._M_elems._32_5_ = 0;
  local_68.m_backend._37_8_ = 0;
  local_68.m_backend.data._M_elems[4] = 0;
  local_68.m_backend.data._M_elems[5] = 0;
  local_68.m_backend.data._M_elems._24_5_ = 0;
  local_68.m_backend.data._M_elems[7]._1_3_ = 0;
  local_68.m_backend.data._M_elems[0] = 0;
  local_68.m_backend.data._M_elems[1] = 0;
  local_68.m_backend.data._M_elems[2] = 0;
  local_68.m_backend.data._M_elems[3] = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,0.0);
  pTVar1 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  RVar4 = Tolerances::epsilon(pTVar1);
  bVar5 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (&local_e8,&local_68,RVar4);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (bVar5) {
    ::soplex::infinity::__tls_init();
    local_1d8 = *(double *)(in_FS_OFFSET + -8);
    local_138 = SUB84(local_1d8,0);
    uStack_134 = (uint)((ulong)local_1d8 >> 0x20) ^ 0x80000000;
    local_178.fpclass = cpp_dec_float_finite;
    local_178.prec_elem = 10;
    local_178.data._M_elems[0] = 0;
    local_178.data._M_elems[1] = 0;
    local_178.data._M_elems[2] = 0;
    local_178.data._M_elems[3] = 0;
    local_178.data._M_elems[4] = 0;
    local_178.data._M_elems[5] = 0;
    local_178.data._M_elems._24_5_ = 0;
    local_178.data._M_elems[7]._1_3_ = 0;
    local_178.data._M_elems._32_5_ = 0;
    local_178.data._M_elems[9]._1_3_ = 0;
    local_178.exp = 0;
    local_178.neg = false;
    uStack_130 = 0;
    uStack_12c = 0x80000000;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_178,-local_1d8);
    pcVar7 = local_180;
    if (((local_180->fpclass == cpp_dec_float_NaN) || (local_178.fpclass == cpp_dec_float_NaN)) ||
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (local_180,&local_178), 0 < iVar6)) {
      local_1c8.fpclass = cpp_dec_float_finite;
      local_1c8.prec_elem = 10;
      local_1c8.data._M_elems[0] = 0;
      local_1c8.data._M_elems[1] = 0;
      local_1c8.data._M_elems[2] = 0;
      local_1c8.data._M_elems[3] = 0;
      local_1c8.data._M_elems[4] = 0;
      local_1c8.data._M_elems[5] = 0;
      local_1c8.data._M_elems._24_5_ = 0;
      local_1c8.data._M_elems[7]._1_3_ = 0;
      local_1c8.data._M_elems._32_5_ = 0;
      local_1c8.data._M_elems[9]._1_3_ = 0;
      local_1c8.exp = 0;
      local_1c8.neg = false;
      if (&local_1c8 == pcVar7) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_1c8,&side->m_backend);
        if (local_1c8.data._M_elems[0] != 0 || local_1c8.fpclass != cpp_dec_float_finite) {
          local_1c8.neg = (bool)(local_1c8.neg ^ 1);
        }
      }
      else {
        if (&local_1c8 != &side->m_backend) {
          uVar3 = *(undefined8 *)((side->m_backend).data._M_elems + 8);
          local_1c8.data._M_elems._32_5_ = SUB85(uVar3,0);
          local_1c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_1c8.data._M_elems._0_8_ = *(undefined8 *)(side->m_backend).data._M_elems;
          local_1c8.data._M_elems._8_8_ = *(undefined8 *)((side->m_backend).data._M_elems + 2);
          local_1c8.data._M_elems._16_8_ = *(undefined8 *)((side->m_backend).data._M_elems + 4);
          uVar3 = *(undefined8 *)((side->m_backend).data._M_elems + 6);
          local_1c8.data._M_elems._24_5_ = SUB85(uVar3,0);
          local_1c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_1c8.exp = (side->m_backend).exp;
          local_1c8.neg = (side->m_backend).neg;
          local_1c8.fpclass = (side->m_backend).fpclass;
          local_1c8.prec_elem = (side->m_backend).prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_1c8,pcVar7);
      }
      local_178.fpclass = cpp_dec_float_finite;
      local_178.prec_elem = 10;
      local_178.data._M_elems[0] = 0;
      local_178.data._M_elems[1] = 0;
      local_178.data._M_elems[2] = 0;
      local_178.data._M_elems[3] = 0;
      local_178.data._M_elems[4] = 0;
      local_178.data._M_elems[5] = 0;
      local_178.data._M_elems._24_5_ = 0;
      local_178.data._M_elems[7]._1_3_ = 0;
      local_178.data._M_elems._32_5_ = 0;
      local_178.data._M_elems[9]._1_3_ = 0;
      local_178.exp = 0;
      local_178.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_178,&local_1c8,&val->m_backend);
      *(ulong *)((minVal->m_backend).data._M_elems + 8) =
           CONCAT35(local_178.data._M_elems[9]._1_3_,local_178.data._M_elems._32_5_);
      *(undefined8 *)((minVal->m_backend).data._M_elems + 4) = local_178.data._M_elems._16_8_;
      *(ulong *)((minVal->m_backend).data._M_elems + 6) =
           CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
      *(undefined8 *)(minVal->m_backend).data._M_elems = local_178.data._M_elems._0_8_;
      *(undefined8 *)((minVal->m_backend).data._M_elems + 2) = local_178.data._M_elems._8_8_;
    }
    else {
      ::soplex::infinity::__tls_init();
      local_178.fpclass = cpp_dec_float_finite;
      local_178.prec_elem = 10;
      local_178.data._M_elems[0] = 0;
      local_178.data._M_elems[1] = 0;
      local_178.data._M_elems[2] = 0;
      local_178.data._M_elems[3] = 0;
      local_178.data._M_elems[4] = 0;
      local_178.data._M_elems[5] = 0;
      local_178.data._M_elems._24_5_ = 0;
      local_178.data._M_elems[7]._1_3_ = 0;
      local_178.data._M_elems._32_5_ = 0;
      local_178.data._M_elems[9]._1_3_ = 0;
      local_178.exp = 0;
      local_178.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_178,(double)CONCAT44(uStack_134,local_138));
      *(undefined8 *)(minVal->m_backend).data._M_elems = local_178.data._M_elems._0_8_;
      *(undefined8 *)((minVal->m_backend).data._M_elems + 2) = local_178.data._M_elems._8_8_;
      *(undefined8 *)((minVal->m_backend).data._M_elems + 4) = local_178.data._M_elems._16_8_;
      *(ulong *)((minVal->m_backend).data._M_elems + 6) =
           CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
      *(ulong *)((minVal->m_backend).data._M_elems + 8) =
           CONCAT35(local_178.data._M_elems[9]._1_3_,local_178.data._M_elems._32_5_);
    }
    pcVar7 = local_188;
    (minVal->m_backend).exp = local_178.exp;
    (minVal->m_backend).neg = local_178.neg;
    (minVal->m_backend).fpclass = local_178.fpclass;
    (minVal->m_backend).prec_elem = local_178.prec_elem;
    ::soplex::infinity::__tls_init();
    local_178.fpclass = cpp_dec_float_finite;
    local_178.prec_elem = 10;
    local_178.data._M_elems[0] = 0;
    local_178.data._M_elems[1] = 0;
    local_178.data._M_elems[2] = 0;
    local_178.data._M_elems[3] = 0;
    local_178.data._M_elems[4] = 0;
    local_178.data._M_elems[5] = 0;
    local_178.data._M_elems._24_5_ = 0;
    local_178.data._M_elems[7]._1_3_ = 0;
    local_178.data._M_elems._32_5_ = 0;
    local_178.data._M_elems[9]._1_3_ = 0;
    local_178.exp = 0;
    local_178.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_178,local_1d8);
    if (((pcVar7->fpclass != cpp_dec_float_NaN) && (local_178.fpclass != cpp_dec_float_NaN)) &&
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (pcVar7,&local_178), -1 < iVar6)) {
LAB_003100ae:
      ::soplex::infinity::__tls_init();
      local_178.fpclass = cpp_dec_float_finite;
      local_178.prec_elem = 10;
      local_178.data._M_elems[0] = 0;
      local_178.data._M_elems[1] = 0;
      local_178.data._M_elems[2] = 0;
      local_178.data._M_elems[3] = 0;
      local_178.data._M_elems[4] = 0;
      local_178.data._M_elems[5] = 0;
      local_178.data._M_elems._24_5_ = 0;
      local_178.data._M_elems[7]._1_3_ = 0;
      local_178.data._M_elems._32_5_ = 0;
      local_178.data._M_elems[9]._1_3_ = 0;
      local_178.exp = 0;
      local_178.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_178,local_1d8);
      *(undefined8 *)(maxVal->m_backend).data._M_elems = local_178.data._M_elems._0_8_;
      *(undefined8 *)((maxVal->m_backend).data._M_elems + 2) = local_178.data._M_elems._8_8_;
      *(undefined8 *)((maxVal->m_backend).data._M_elems + 4) = local_178.data._M_elems._16_8_;
      *(ulong *)((maxVal->m_backend).data._M_elems + 6) =
           CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
      *(ulong *)((maxVal->m_backend).data._M_elems + 8) =
           CONCAT35(local_178.data._M_elems[9]._1_3_,local_178.data._M_elems._32_5_);
      goto LAB_00310152;
    }
  }
  else {
    local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
    local_128.m_backend.exp = (val->m_backend).exp;
    local_128.m_backend.neg = (val->m_backend).neg;
    local_128.m_backend.fpclass = (val->m_backend).fpclass;
    local_128.m_backend.prec_elem = (val->m_backend).prec_elem;
    local_a8.m_backend.fpclass = cpp_dec_float_finite;
    local_a8.m_backend.prec_elem = 10;
    local_a8.m_backend.data._M_elems[0] = 0;
    local_a8.m_backend.data._M_elems[1] = 0;
    local_a8.m_backend.data._M_elems[2] = 0;
    local_a8.m_backend.data._M_elems[3] = 0;
    local_a8.m_backend.data._M_elems[4] = 0;
    local_a8.m_backend.data._M_elems[5] = 0;
    local_a8.m_backend.data._M_elems._24_5_ = 0;
    local_a8.m_backend.data._M_elems[7]._1_3_ = 0;
    local_a8.m_backend.data._M_elems._32_5_ = 0;
    local_a8.m_backend._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_a8,0.0);
    pTVar1 = (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var2 = (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    RVar4 = Tolerances::epsilon(pTVar1);
    bVar5 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_128,&local_a8,RVar4);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (!bVar5) {
      return;
    }
    ::soplex::infinity::__tls_init();
    local_1d8 = *(double *)(in_FS_OFFSET + -8);
    local_178.fpclass = cpp_dec_float_finite;
    local_178.prec_elem = 10;
    local_178.data._M_elems[0] = 0;
    local_178.data._M_elems[1] = 0;
    local_178.data._M_elems[2] = 0;
    local_178.data._M_elems[3] = 0;
    local_178.data._M_elems[4] = 0;
    local_178.data._M_elems[5] = 0;
    local_178.data._M_elems._24_5_ = 0;
    local_178.data._M_elems[7]._1_3_ = 0;
    local_178.data._M_elems._32_5_ = 0;
    local_178.data._M_elems[9]._1_3_ = 0;
    local_178.exp = 0;
    local_178.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_178,local_1d8);
    pcVar7 = local_188;
    if (((local_188->fpclass == cpp_dec_float_NaN) || (local_178.fpclass == cpp_dec_float_NaN)) ||
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (local_188,&local_178), iVar6 < 0)) {
      local_1c8.fpclass = cpp_dec_float_finite;
      local_1c8.prec_elem = 10;
      local_1c8.data._M_elems[0] = 0;
      local_1c8.data._M_elems[1] = 0;
      local_1c8.data._M_elems[2] = 0;
      local_1c8.data._M_elems[3] = 0;
      local_1c8.data._M_elems[4] = 0;
      local_1c8.data._M_elems[5] = 0;
      local_1c8.data._M_elems._24_5_ = 0;
      local_1c8.data._M_elems[7]._1_3_ = 0;
      local_1c8.data._M_elems._32_5_ = 0;
      local_1c8.data._M_elems[9]._1_3_ = 0;
      local_1c8.exp = 0;
      local_1c8.neg = false;
      if (&local_1c8 == pcVar7) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_1c8,&side->m_backend);
        if (local_1c8.data._M_elems[0] != 0 || local_1c8.fpclass != cpp_dec_float_finite) {
          local_1c8.neg = (bool)(local_1c8.neg ^ 1);
        }
      }
      else {
        if (&local_1c8 != &side->m_backend) {
          uVar3 = *(undefined8 *)((side->m_backend).data._M_elems + 8);
          local_1c8.data._M_elems._32_5_ = SUB85(uVar3,0);
          local_1c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_1c8.data._M_elems._0_8_ = *(undefined8 *)(side->m_backend).data._M_elems;
          local_1c8.data._M_elems._8_8_ = *(undefined8 *)((side->m_backend).data._M_elems + 2);
          local_1c8.data._M_elems._16_8_ = *(undefined8 *)((side->m_backend).data._M_elems + 4);
          uVar3 = *(undefined8 *)((side->m_backend).data._M_elems + 6);
          local_1c8.data._M_elems._24_5_ = SUB85(uVar3,0);
          local_1c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_1c8.exp = (side->m_backend).exp;
          local_1c8.neg = (side->m_backend).neg;
          local_1c8.fpclass = (side->m_backend).fpclass;
          local_1c8.prec_elem = (side->m_backend).prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_1c8,pcVar7);
      }
      local_178.fpclass = cpp_dec_float_finite;
      local_178.prec_elem = 10;
      local_178.data._M_elems[0] = 0;
      local_178.data._M_elems[1] = 0;
      local_178.data._M_elems[2] = 0;
      local_178.data._M_elems[3] = 0;
      local_178.data._M_elems[4] = 0;
      local_178.data._M_elems[5] = 0;
      local_178.data._M_elems._24_5_ = 0;
      local_178.data._M_elems[7]._1_3_ = 0;
      local_178.data._M_elems._32_5_ = 0;
      local_178.data._M_elems[9]._1_3_ = 0;
      local_178.exp = 0;
      local_178.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_178,&local_1c8,&val->m_backend);
      *(ulong *)((minVal->m_backend).data._M_elems + 8) =
           CONCAT35(local_178.data._M_elems[9]._1_3_,local_178.data._M_elems._32_5_);
      *(undefined8 *)((minVal->m_backend).data._M_elems + 4) = local_178.data._M_elems._16_8_;
      *(ulong *)((minVal->m_backend).data._M_elems + 6) =
           CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
      *(undefined8 *)(minVal->m_backend).data._M_elems = local_178.data._M_elems._0_8_;
      *(undefined8 *)((minVal->m_backend).data._M_elems + 2) = local_178.data._M_elems._8_8_;
    }
    else {
      ::soplex::infinity::__tls_init();
      local_178.fpclass = cpp_dec_float_finite;
      local_178.prec_elem = 10;
      local_178.data._M_elems[0] = 0;
      local_178.data._M_elems[1] = 0;
      local_178.data._M_elems[2] = 0;
      local_178.data._M_elems[3] = 0;
      local_178.data._M_elems[4] = 0;
      local_178.data._M_elems[5] = 0;
      local_178.data._M_elems._24_5_ = 0;
      local_178.data._M_elems[7]._1_3_ = 0;
      local_178.data._M_elems._32_5_ = 0;
      local_178.data._M_elems[9]._1_3_ = 0;
      local_178.exp = 0;
      local_178.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_178,-local_1d8);
      *(undefined8 *)(minVal->m_backend).data._M_elems = local_178.data._M_elems._0_8_;
      *(undefined8 *)((minVal->m_backend).data._M_elems + 2) = local_178.data._M_elems._8_8_;
      *(undefined8 *)((minVal->m_backend).data._M_elems + 4) = local_178.data._M_elems._16_8_;
      *(ulong *)((minVal->m_backend).data._M_elems + 6) =
           CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
      *(ulong *)((minVal->m_backend).data._M_elems + 8) =
           CONCAT35(local_178.data._M_elems[9]._1_3_,local_178.data._M_elems._32_5_);
    }
    pcVar7 = local_180;
    (minVal->m_backend).exp = local_178.exp;
    (minVal->m_backend).neg = local_178.neg;
    (minVal->m_backend).fpclass = local_178.fpclass;
    (minVal->m_backend).prec_elem = local_178.prec_elem;
    ::soplex::infinity::__tls_init();
    local_178.fpclass = cpp_dec_float_finite;
    local_178.prec_elem = 10;
    local_178.data._M_elems[0] = 0;
    local_178.data._M_elems[1] = 0;
    local_178.data._M_elems[2] = 0;
    local_178.data._M_elems[3] = 0;
    local_178.data._M_elems[4] = 0;
    local_178.data._M_elems[5] = 0;
    local_178.data._M_elems._24_5_ = 0;
    local_178.data._M_elems[7]._1_3_ = 0;
    local_178.data._M_elems._32_5_ = 0;
    local_178.data._M_elems[9]._1_3_ = 0;
    local_178.exp = 0;
    local_178.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_178,-local_1d8);
    if (((pcVar7->fpclass != cpp_dec_float_NaN) && (local_178.fpclass != cpp_dec_float_NaN)) &&
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (pcVar7,&local_178), iVar6 < 1)) goto LAB_003100ae;
  }
  local_1c8.fpclass = cpp_dec_float_finite;
  local_1c8.prec_elem = 10;
  local_1c8.data._M_elems[0] = 0;
  local_1c8.data._M_elems[1] = 0;
  local_1c8.data._M_elems[2] = 0;
  local_1c8.data._M_elems[3] = 0;
  local_1c8.data._M_elems[4] = 0;
  local_1c8.data._M_elems[5] = 0;
  local_1c8.data._M_elems._24_5_ = 0;
  local_1c8.data._M_elems[7]._1_3_ = 0;
  local_1c8.data._M_elems._32_5_ = 0;
  local_1c8.data._M_elems[9]._1_3_ = 0;
  local_1c8.exp = 0;
  local_1c8.neg = false;
  if (&local_1c8 == pcVar7) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              (&local_1c8,&side->m_backend);
    if (local_1c8.data._M_elems[0] != 0 || local_1c8.fpclass != cpp_dec_float_finite) {
      local_1c8.neg = (bool)(local_1c8.neg ^ 1);
    }
  }
  else {
    if (&local_1c8 != &side->m_backend) {
      uVar3 = *(undefined8 *)((side->m_backend).data._M_elems + 8);
      local_1c8.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_1c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_1c8.data._M_elems._0_8_ = *(undefined8 *)(side->m_backend).data._M_elems;
      local_1c8.data._M_elems._8_8_ = *(undefined8 *)((side->m_backend).data._M_elems + 2);
      local_1c8.data._M_elems._16_8_ = *(undefined8 *)((side->m_backend).data._M_elems + 4);
      uVar3 = *(undefined8 *)((side->m_backend).data._M_elems + 6);
      local_1c8.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_1c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_1c8.exp = (side->m_backend).exp;
      local_1c8.neg = (side->m_backend).neg;
      local_1c8.fpclass = (side->m_backend).fpclass;
      local_1c8.prec_elem = (side->m_backend).prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_1c8,pcVar7);
  }
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems._24_5_ = 0;
  local_178.data._M_elems[7]._1_3_ = 0;
  local_178.data._M_elems._32_5_ = 0;
  local_178.data._M_elems[9]._1_3_ = 0;
  local_178.exp = 0;
  local_178.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_178,&local_1c8,&val->m_backend);
  *(ulong *)((maxVal->m_backend).data._M_elems + 8) =
       CONCAT35(local_178.data._M_elems[9]._1_3_,local_178.data._M_elems._32_5_);
  *(undefined8 *)((maxVal->m_backend).data._M_elems + 4) = local_178.data._M_elems._16_8_;
  *(ulong *)((maxVal->m_backend).data._M_elems + 6) =
       CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
  *(undefined8 *)(maxVal->m_backend).data._M_elems = local_178.data._M_elems._0_8_;
  *(undefined8 *)((maxVal->m_backend).data._M_elems + 2) = local_178.data._M_elems._8_8_;
LAB_00310152:
  (maxVal->m_backend).exp = local_178.exp;
  (maxVal->m_backend).neg = local_178.neg;
  (maxVal->m_backend).fpclass = local_178.fpclass;
  (maxVal->m_backend).prec_elem = local_178.prec_elem;
  return;
}

Assistant:

void SPxMainSM<R>::computeMinMaxValues(SPxLPBase<R>& lp, R side, R val, R minRes, R maxRes,
                                       R& minVal, R& maxVal)
{
   minVal = 0;
   maxVal = 0;

   if(LT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(minRes <= R(-infinity))
         minVal = R(-infinity);
      else
         minVal = (side - minRes) / val;

      if(maxRes >= R(infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - maxRes) / val;
   }
   else if(GT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(maxRes >= R(infinity))
         minVal = R(-infinity);
      else
         minVal = (side - maxRes) / val;

      if(minRes <= R(-infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - minRes) / val;
   }
}